

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O2

void mt32emu_get_rom_info(mt32emu_const_context context,mt32emu_rom_info *rom_info)

{
  ROMInfo *pRVar1;
  ROMInfo *pRVar2;
  SHA1Digest *pacVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  
  if (context->controlROMImage == (ROMImage *)0x0) {
    pRVar1 = (ROMInfo *)0x0;
  }
  else {
    pRVar1 = MT32Emu::ROMImage::getROMInfo(context->controlROMImage);
  }
  if (context->pcmROMImage == (ROMImage *)0x0) {
    pRVar2 = (ROMInfo *)0x0;
  }
  else {
    pRVar2 = MT32Emu::ROMImage::getROMInfo(context->pcmROMImage);
  }
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  if (pRVar1 == (ROMInfo *)0x0) {
    pacVar3 = (SHA1Digest *)0x0;
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
  }
  else {
    uVar8 = *(undefined4 *)&pRVar1->shortName;
    uVar9 = *(undefined4 *)((long)&pRVar1->shortName + 4);
    uVar10 = *(undefined4 *)&pRVar1->description;
    uVar11 = *(undefined4 *)((long)&pRVar1->description + 4);
    pacVar3 = pRVar1->sha1Digest;
  }
  *(undefined4 *)&rom_info->control_rom_id = uVar8;
  *(undefined4 *)((long)&rom_info->control_rom_id + 4) = uVar9;
  *(undefined4 *)&rom_info->control_rom_description = uVar10;
  *(undefined4 *)((long)&rom_info->control_rom_description + 4) = uVar11;
  rom_info->control_rom_sha1_digest = *pacVar3;
  if (pRVar2 == (ROMInfo *)0x0) {
    pacVar3 = (SHA1Digest *)0x0;
  }
  else {
    uVar4 = *(undefined4 *)&pRVar2->shortName;
    uVar5 = *(undefined4 *)((long)&pRVar2->shortName + 4);
    uVar6 = *(undefined4 *)&pRVar2->description;
    uVar7 = *(undefined4 *)((long)&pRVar2->description + 4);
    pacVar3 = pRVar2->sha1Digest;
  }
  *(undefined4 *)&rom_info->pcm_rom_id = uVar4;
  *(undefined4 *)((long)&rom_info->pcm_rom_id + 4) = uVar5;
  *(undefined4 *)&rom_info->pcm_rom_description = uVar6;
  *(undefined4 *)((long)&rom_info->pcm_rom_description + 4) = uVar7;
  rom_info->pcm_rom_sha1_digest = *pacVar3;
  return;
}

Assistant:

void MT32EMU_C_CALL mt32emu_get_rom_info(mt32emu_const_context context, mt32emu_rom_info *rom_info) {
	const ROMInfo *controlROMInfo = context->controlROMImage == NULL ? NULL : context->controlROMImage->getROMInfo();
	const ROMInfo *pcmROMInfo = context->pcmROMImage == NULL ? NULL : context->pcmROMImage->getROMInfo();
	fillROMInfo(rom_info, controlROMInfo, pcmROMInfo);
}